

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * phyr::Transform::rotateX(double theta)

{
  double dVar1;
  Transform *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double sinTheta;
  double cosTheta;
  Mat4x4 m;
  Mat4x4 *in_stack_fffffffffffffd90;
  Mat4x4 *invMat;
  Mat4x4 *in_stack_fffffffffffffd98;
  Transform *in_stack_fffffffffffffda0;
  Mat4x4 *in_stack_fffffffffffffdd0;
  _Mat4x4 local_198;
  _Mat4x4 local_118;
  Mat4x4 *local_98;
  Mat4x4 *local_90;
  _Mat4x4 local_88;
  double local_8;
  
  local_8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  _Mat4x4::_Mat4x4(&local_88);
  dVar1 = radians(local_8);
  local_90 = (Mat4x4 *)cos(dVar1);
  dVar1 = radians(local_8);
  invMat = (Mat4x4 *)sin(dVar1);
  local_98 = invMat;
  if ((local_8 != 0.0) || (NAN(local_8))) {
    in_stack_fffffffffffffdd0 = (Mat4x4 *)0x0;
    in_stack_fffffffffffffda0 = (Transform *)0x0;
    in_stack_fffffffffffffd98 = local_90;
    _Mat4x4::_Mat4x4(&local_198,1.0,0.0,0.0,0.0,0.0,(double)local_90,-(double)invMat,0.0,0.0,
                     (double)invMat,(double)local_90,0.0,0.0,0.0,0.0,1.0);
    memcpy(&local_88,&local_198,0x80);
  }
  else {
    _Mat4x4::_Mat4x4(&local_118);
    memcpy(&local_88,&local_118,0x80);
    invMat = in_stack_fffffffffffffd90;
  }
  _Mat4x4::transpose(in_stack_fffffffffffffdd0);
  Transform(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,invMat);
  return in_RDI;
}

Assistant:

Transform Transform::rotateX(Real theta) {
    Mat4x4 m;
    Real cosTheta = std::cos(radians(theta));
    Real sinTheta = std::sin(radians(theta));

    if (theta == 0.0)
        m = Mat4x4(); // Identity
    else {
        m = Mat4x4(1,        0,          0, 0,
                   0,  cosTheta, -sinTheta, 0,
                   0,  sinTheta,  cosTheta, 0,
                   0,        0,          0, 1);
    }

    return Transform(m, Mat4x4::transpose(m));
}